

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::CFactory::getDisplayName
          (CFactory *this,UnicodeString *id,Locale *locale,UnicodeString *result)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  undefined4 extraout_var_00;
  UErrorCode status;
  Locale loc;
  Locale local_108;
  
  if (((this->super_LocaleKeyFactory)._coverage & 1) == 0) {
    iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[8])
                      ();
    if (((Hashtable *)CONCAT44(extraout_var,iVar1) != (Hashtable *)0x0) &&
       (pvVar2 = Hashtable::get((Hashtable *)CONCAT44(extraout_var,iVar1),id), pvVar2 != (void *)0x0
       )) {
      Locale::Locale(&local_108);
      LocaleUtility::initLocaleFromName(id,&local_108);
      iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[5])
                        (this->_delegate,&local_108,locale,result);
      Locale::~Locale(&local_108);
      return (UnicodeString *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  UnicodeString::setToBogus(result);
  return result;
}

Assistant:

UnicodeString&
CFactory::getDisplayName(const UnicodeString& id, const Locale& locale, UnicodeString& result) const 
{
    if ((_coverage & 0x1) == 0) {
        UErrorCode status = U_ZERO_ERROR;
        const Hashtable* ids = getSupportedIDs(status);
        if (ids && (ids->get(id) != NULL)) {
            Locale loc;
            LocaleUtility::initLocaleFromName(id, loc);
            return _delegate->getDisplayName(loc, locale, result);
        }
    }
    result.setToBogus();
    return result;
}